

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O2

void __thiscall duckdb::CSVReaderOptions::SetComment(CSVReaderOptions *this,string *comment_p)

{
  InvalidInputException *this_00;
  allocator local_59;
  string local_58;
  string comment_str;
  
  ::std::__cxx11::string::string((string *)&comment_str,(string *)comment_p);
  if (comment_str._M_string_length < 2) {
    if (comment_str._M_string_length == 0) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      local_58.field_2._M_allocated_capacity._0_2_ = 0;
      local_58._M_string_length = 1;
      ::std::__cxx11::string::operator=((string *)&comment_str,(string *)&local_58);
      ::std::__cxx11::string::~string((string *)&local_58);
    }
    if ((this->dialect_options).state_machine_options.comment.set_by_user == false) {
      (this->dialect_options).state_machine_options.comment.value = *comment_str._M_dataplus._M_p;
      (this->dialect_options).state_machine_options.comment.set_by_user = true;
    }
    ::std::__cxx11::string::~string((string *)&comment_str);
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_58,"The comment option cannot exceed a size of 1 byte.",&local_59);
  InvalidInputException::InvalidInputException(this_00,&local_58);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CSVReaderOptions::SetComment(const string &comment_p) {
	auto comment_str = comment_p;
	if (comment_str.size() > 1) {
		throw InvalidInputException("The comment option cannot exceed a size of 1 byte.");
	}
	if (comment_str.empty()) {
		comment_str = string("\0", 1);
	}
	this->dialect_options.state_machine_options.comment.Set(comment_str[0]);
}